

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O1

uint32_t ndn_signature_info_probe_block_size(ndn_signature_t *signature)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  if (signature->enable_KeyLocator == '\0') {
    uVar1 = 3;
  }
  else {
    uVar4 = (ulong)(signature->key_locator_name).components_size;
    if (uVar4 == 0) {
      uVar1 = 0;
    }
    else {
      lVar6 = 0;
      uVar1 = 0;
      do {
        uVar2 = *(uint *)((signature->key_locator_name).components[0].value + lVar6 + -4);
        uVar7 = (uint)(signature->key_locator_name).components[0].value[lVar6 + 0x24];
        iVar5 = (0xffff < uVar2) + 3 + (uint)(0xffff < uVar2);
        if (uVar2 < 0xfd) {
          iVar5 = 1;
        }
        uVar1 = uVar1 + uVar7 + iVar5 + (uint)(0xfc < uVar7) * 2 + 1;
        lVar6 = lVar6 + 0x2c;
      } while (uVar4 * 0x2c - lVar6 != 0);
    }
    iVar5 = (0xffff < uVar1) + 3 + (uint)(0xffff < uVar1);
    if (uVar1 < 0xfd) {
      iVar5 = 1;
    }
    uVar2 = uVar1 + iVar5 + 1;
    iVar3 = (uint)(0xffff < uVar2) * 2 + 3;
    if (uVar2 < 0xfd) {
      iVar3 = 1;
    }
    uVar1 = iVar3 + uVar1 + iVar5 + 5;
  }
  uVar2 = uVar1 + 0x2a;
  if (signature->enable_ValidityPeriod == '\0') {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 + 6;
  if (signature->enable_SignatureNonce == '\0') {
    uVar1 = uVar2;
  }
  if (signature->enable_Timestamp != '\0') {
    uVar4 = signature->timestamp;
    iVar5 = 3;
    if ((0xff < uVar4) && (iVar5 = 4, 0xffff < uVar4)) {
      iVar5 = (uint)(uVar4 >> 0x20 != 0) * 4 + 6;
    }
    uVar1 = uVar1 + iVar5;
  }
  if (signature->enable_Seqnum != '\0') {
    uVar4 = signature->seqnum;
    iVar5 = 3;
    if ((0xff < uVar4) && (iVar5 = 4, 0xffff < uVar4)) {
      iVar5 = (uint)(uVar4 >> 0x20 != 0) * 4 + 6;
    }
    uVar1 = uVar1 + iVar5;
  }
  iVar5 = 1;
  if (0xfc < uVar1) {
    iVar5 = (0xffff < uVar1) + 3 + (uint)(0xffff < uVar1);
  }
  return uVar1 + iVar5 + 1;
}

Assistant:

static inline uint32_t
ndn_signature_info_probe_block_size(const ndn_signature_t* signature)
{
  // signature type
  uint32_t info_buffer_size = encoder_probe_block_size(TLV_SignatureType, 1);

  if (signature->enable_KeyLocator > 0) {
    uint32_t key_name_block_size = ndn_name_probe_block_size(&signature->key_locator_name);
    info_buffer_size += encoder_probe_block_size(TLV_KeyLocator, key_name_block_size);
  }
  if (signature->enable_ValidityPeriod > 0) {
    uint32_t validity_period_buffer_size = encoder_probe_block_size(TLV_NotBefore, 15);
    validity_period_buffer_size += encoder_probe_block_size(TLV_NotAfter, 15);
    info_buffer_size += encoder_probe_block_size(TLV_ValidityPeriod, validity_period_buffer_size);
  }
  if (signature->enable_SignatureNonce > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SignatureNonce, 4);
  }
  if (signature->enable_Timestamp > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_Timestamp,
                                                 encoder_probe_uint_length(signature->timestamp));
  }
  if (signature->enable_Seqnum > 0) {
    info_buffer_size += encoder_probe_block_size(TLV_SeqNum,
                                                 encoder_probe_uint_length(signature->seqnum));
  }
  if (signature->is_interest)
    return encoder_probe_block_size(TLV_InterestSignatureInfo, info_buffer_size);
  else
    return encoder_probe_block_size(TLV_SignatureInfo, info_buffer_size);
}